

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmidl-read.c
# Opt level: O0

void on_declaration(tmidl_declaration_t *declaration,void *user_context)

{
  ulong local_20;
  size_t i;
  void *user_context_local;
  tmidl_declaration_t *declaration_local;
  
  printf("# %s\n",declaration->name);
  if (declaration->type == TMIDL_ITEM_OPAQUE) {
    printf("Type: Opaque\n");
  }
  else if (declaration->type == TMIDL_ITEM_INTERFACE) {
    printf("Type: Interface\n");
  }
  for (local_20 = 0; local_20 < declaration->functions_count; local_20 = local_20 + 1) {
    printf("Function: %s\n",declaration->functions[local_20]->name);
  }
  printf("\n");
  return;
}

Assistant:

static void on_declaration(const tmidl_declaration_t *declaration, void *user_context)
{
    printf("# %s\n", declaration->name);

    switch (declaration->type) {
    case TMIDL_ITEM_OPAQUE:
        printf("Type: Opaque\n");
        break;
    case TMIDL_ITEM_INTERFACE:
        printf("Type: Interface\n");
        break;
    }

    for (size_t i = 0; i < declaration->functions_count; i++) {
        printf("Function: %s\n", declaration->functions[i]->name);
    }

    printf("\n");
}